

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

string * __thiscall
el::base::utils::DateTime::timevalToString_abi_cxx11_
          (string *__return_storage_ptr__,DateTime *this,timeval tval,char *format,
          SubsecondPrecision *ssPrec)

{
  allocator<char> local_99;
  timeval tval_local;
  char buff_ [30];
  tm timeInfo;
  
  tval_local.tv_sec = (__time_t)this;
  tval_local.tv_usec = tval.tv_sec;
  buildTimeInfo(&tval_local,&timeInfo);
  buff_[0x10] = '\0';
  buff_[0x11] = '\0';
  buff_[0x12] = '\0';
  buff_[0x13] = '\0';
  buff_[0x14] = '\0';
  buff_[0x15] = '\0';
  buff_[0x16] = '\0';
  buff_[0x17] = '\0';
  buff_[0x18] = '\0';
  buff_[0x19] = '\0';
  buff_[0x1a] = '\0';
  buff_[0x1b] = '\0';
  buff_[0x1c] = '\0';
  buff_[0x1d] = '\0';
  buff_[0] = '\0';
  buff_[1] = '\0';
  buff_[2] = '\0';
  buff_[3] = '\0';
  buff_[4] = '\0';
  buff_[5] = '\0';
  buff_[6] = '\0';
  buff_[7] = '\0';
  buff_[8] = '\0';
  buff_[9] = '\0';
  buff_[10] = '\0';
  buff_[0xb] = '\0';
  buff_[0xc] = '\0';
  buff_[0xd] = '\0';
  buff_[0xe] = '\0';
  buff_[0xf] = '\0';
  parseFormat(buff_,0x1e,(char *)tval.tv_usec,&timeInfo,
              tval.tv_sec / (long)(ulong)*(uint *)(format + 4),(SubsecondPrecision *)format);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,buff_,&local_99);
  return __return_storage_ptr__;
}

Assistant:

std::string DateTime::timevalToString(struct timeval tval, const char* format,
                                      const el::base::SubsecondPrecision* ssPrec) {
  struct ::tm timeInfo;
  buildTimeInfo(&tval, &timeInfo);
  const int kBuffSize = 30;
  char buff_[kBuffSize] = "";
  parseFormat(buff_, kBuffSize, format, &timeInfo, static_cast<std::size_t>(tval.tv_usec / ssPrec->m_offset),
              ssPrec);
  return std::string(buff_);
}